

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

void unbiasnet(nn_quant *nnq)

{
  int iVar1;
  long lVar2;
  nq_pixel *paiVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  iVar1 = nnq->netsize;
  if (0 < (long)iVar1) {
    paiVar3 = nnq->network;
    lVar2 = 0;
    do {
      uVar4 = (*paiVar3)[0] + 8 >> 4;
      uVar5 = (*paiVar3)[1] + 8 >> 4;
      uVar6 = (*paiVar3)[2] + 8 >> 4;
      uVar7 = (*paiVar3)[3] + 8 >> 4;
      uVar8 = -(uint)((int)uVar4 < 0xff);
      uVar9 = -(uint)((int)uVar5 < 0xff);
      uVar10 = -(uint)((int)uVar6 < 0xff);
      uVar11 = -(uint)((int)uVar7 < 0xff);
      (*paiVar3)[0] = ~uVar8 & 0xff | uVar4 & uVar8;
      (*paiVar3)[1] = ~uVar9 & 0xff | uVar5 & uVar9;
      (*paiVar3)[2] = ~uVar10 & 0xff | uVar6 & uVar10;
      (*paiVar3)[3] = ~uVar11 & 0xff | uVar7 & uVar11;
      (*paiVar3)[4] = (int)lVar2;
      lVar2 = lVar2 + 1;
      paiVar3 = paiVar3 + 1;
    } while (iVar1 != lVar2);
  }
  return;
}

Assistant:

void unbiasnet(nn_quant *nnq)
{
	int i,j,temp;

	for (i=0; i < nnq->netsize; i++) {
		for (j=0; j<4; j++) {
			/* OLD CODE: network[i][j] >>= netbiasshift; */
			/* Fix based on bug report by Juergen Weigert jw@suse.de */
			temp = (nnq->network[i][j] + (1 << (netbiasshift - 1))) >> netbiasshift;
			if (temp > 255) temp = 255;
			nnq->network[i][j] = temp;
		}
		nnq->network[i][4] = i;			/* record colour no */
	}
}